

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O1

void __thiscall slang::ast::MethodBuilder::~MethodBuilder(MethodBuilder *this)

{
  SubroutineSymbol *pSVar1;
  pointer p;
  int iVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  size_t extraout_RDX;
  
  if ((this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len != 0) {
    pSVar1 = this->symbol;
    iVar2 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (&(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>
                       ,(EVP_PKEY_CTX *)this->compilation,in_RDX);
    (pSVar1->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    (pSVar1->arguments)._M_extent._M_extent_value = extraout_RDX;
    if ((pSVar1->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged == true) {
      (pSVar1->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged = false;
    }
  }
  p = (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.data_;
  if (p != (pointer)(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
                    firstElement) {
    operator_delete(p);
    return;
  }
  return;
}

Assistant:

MethodBuilder::~MethodBuilder() {
    if (!args.empty())
        symbol.setArguments(args.copy(compilation));
}